

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

bool __thiscall pbrt::syntactic::ParamSet::hasParam1i(ParamSet *this,string *name)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  bool local_46;
  string *in_stack_ffffffffffffffd0;
  ParamSet *in_stack_ffffffffffffffd8;
  
  findParam<int>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd8);
  local_46 = false;
  if (bVar1) {
    findParam<int>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1de7ea);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      (&peVar2->super_vector<int,_std::allocator<int>_>);
    local_46 = sVar3 == 1;
    std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1de81e);
  }
  std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1de828);
  return local_46;
}

Assistant:

bool hasParam1i(const std::string &name) const {
        return  (bool)findParam<int>(name) && findParam<int>(name)->size() == 1;
      }